

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_isSolveStopped(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,bool *stoppedTime,bool *stoppedIter)

{
  int iVar1;
  int iVar2;
  byte *in_RDX;
  byte *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  Real RVar3;
  Real RVar4;
  double extraout_XMM0_Qa;
  byte local_4d;
  bool local_45;
  bool local_39;
  bool local_19;
  
  RVar3 = realParam(in_RDI,TIMELIMIT);
  RVar4 = realParam(in_RDI,INFTY);
  local_19 = false;
  if (RVar3 < RVar4) {
    (*in_RDI->_statistics->solvingTime->_vptr_Timer[6])();
    RVar3 = realParam(in_RDI,TIMELIMIT);
    local_19 = RVar3 <= extraout_XMM0_Qa;
  }
  *in_RSI = local_19;
  iVar1 = intParam(in_RDI,ITERLIMIT);
  if (-1 < iVar1) {
    iVar1 = in_RDI->_statistics->iterations;
    iVar2 = intParam(in_RDI,ITERLIMIT);
    local_39 = true;
    if (iVar2 <= iVar1) goto LAB_0047e2ae;
  }
  iVar1 = intParam(in_RDI,REFLIMIT);
  if (-1 < iVar1) {
    iVar1 = in_RDI->_statistics->refinements;
    iVar2 = intParam(in_RDI,REFLIMIT);
    local_39 = true;
    if (iVar2 <= iVar1) goto LAB_0047e2ae;
  }
  iVar1 = intParam(in_RDI,STALLREFLIMIT);
  local_45 = false;
  if (-1 < iVar1) {
    iVar1 = in_RDI->_statistics->stallRefinements;
    iVar2 = intParam(in_RDI,STALLREFLIMIT);
    local_45 = iVar2 <= iVar1;
  }
  local_39 = local_45;
LAB_0047e2ae:
  *in_RDX = local_39;
  local_4d = 1;
  if ((*in_RSI & 1) == 0) {
    local_4d = *in_RDX;
  }
  return (bool)(local_4d & 1);
}

Assistant:

bool SoPlexBase<R>::_isSolveStopped(bool& stoppedTime, bool& stoppedIter) const
{
   assert(_statistics != nullptr);

   stoppedTime = (realParam(TIMELIMIT) < realParam(INFTY)
                  && _statistics->solvingTime->time() >= realParam(TIMELIMIT));
   stoppedIter = (intParam(ITERLIMIT) >= 0 && _statistics->iterations >= intParam(ITERLIMIT))
                 || (intParam(REFLIMIT) >= 0 && _statistics->refinements >= intParam(REFLIMIT))
                 || (intParam(STALLREFLIMIT) >= 0 && _statistics->stallRefinements >= intParam(STALLREFLIMIT));

   return stoppedTime || stoppedIter;
}